

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPoints.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderPointsVerification::initTest(TessellationShaderPointsVerification *this)

{
  bool bVar1;
  int iVar2;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TessellationShaderUtils *this_01;
  undefined1 local_f8 [8];
  _run run;
  _tessellation_levels *levels;
  __normal_iterator<glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
  local_c8;
  __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
  local_c0;
  _tessellation_levels_set_const_iterator levels_set_iterator;
  _tessellation_shader_vertex_spacing vertex_spacing;
  uint n_vertex_spacing;
  float local_94;
  undefined1 local_90 [4];
  _tessellation_primitive_mode primitive_mode;
  _tessellation_levels_set levels_set;
  uint n_primitive_mode;
  uint n_vertex_spacings;
  _tessellation_shader_vertex_spacing vertex_spacings [3];
  uint n_primitive_modes;
  _tessellation_primitive_mode primitive_modes [3];
  GLint gl_max_tess_gen_level_value;
  allocator<char> local_39;
  string local_38;
  Functions *local_18;
  Functions *gl;
  TessellationShaderPointsVerification *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  local_18 = (Functions *)CONCAT44(extraout_var,iVar2);
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) != 0) {
    (*local_18->genVertexArrays)(1,&this->m_vao_id);
    GVar3 = (*local_18->getError)();
    glu::checkError(GVar3,"Could not generate vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPoints.cpp"
                    ,0x29c);
    (*local_18->bindVertexArray)(this->m_vao_id);
    GVar3 = (*local_18->getError)();
    glu::checkError(GVar3,"Error binding vertex array object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPoints.cpp"
                    ,0x29f);
    primitive_modes[1] = TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST;
    (*local_18->getIntegerv)
              ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,
               (GLint *)(primitive_modes + 1));
    GVar3 = (*local_18->getError)();
    glu::checkError(GVar3,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPoints.cpp"
                    ,0x2a5);
    stack0xffffffffffffffa0 = 2;
    primitive_modes[0] = TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES;
    vertex_spacings[1] = TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT;
    _n_primitive_mode = 2;
    vertex_spacings[0] = TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN;
    levels_set.
    super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
    for (levels_set.
         super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (uint)levels_set.
              super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage < 3;
        levels_set.
        super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)levels_set.
                   super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::vector
                ((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                  *)local_90);
      local_94 = (float)vertex_spacings
                        [(ulong)(uint)levels_set.
                                      super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 2];
      TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
                ((_tessellation_levels_set *)&vertex_spacing,(_tessellation_primitive_mode)local_94,
                 primitive_modes[1],
                 TESSELLATION_LEVEL_SET_FILTER_INNER_AND_OUTER_LEVELS_USE_DIFFERENT_VALUES);
      std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
      operator=((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *
                )local_90,
                (vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *
                )&vertex_spacing);
      std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
      ~vector((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *)
              &vertex_spacing);
      for (levels_set_iterator._M_current._4_4_ = 0; levels_set_iterator._M_current._4_4_ < 3;
          levels_set_iterator._M_current._4_4_ = levels_set_iterator._M_current._4_4_ + 1) {
        levels_set_iterator._M_current._0_4_ =
             (float)(&n_primitive_mode)[levels_set_iterator._M_current._4_4_];
        local_c8._M_current =
             (_tessellation_levels *)
             std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
             ::begin((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                      *)local_90);
        __gnu_cxx::
        __normal_iterator<glcts::_tessellation_levels_const*,std::vector<glcts::_tessellation_levels,std::allocator<glcts::_tessellation_levels>>>
        ::__normal_iterator<glcts::_tessellation_levels*>
                  ((__normal_iterator<glcts::_tessellation_levels_const*,std::vector<glcts::_tessellation_levels,std::allocator<glcts::_tessellation_levels>>>
                    *)&local_c0,&local_c8);
        while( true ) {
          levels = (_tessellation_levels *)
                   std::
                   vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                   ::end((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                          *)local_90);
          bVar1 = __gnu_cxx::operator!=
                            (&local_c0,
                             (__normal_iterator<glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
                              *)&levels);
          if (!bVar1) break;
          run._24_8_ = __gnu_cxx::
                       __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
                       ::operator*(&local_c0);
          if ((((local_94 != 2.8026e-45) && (local_94 != 1.4013e-45)) ||
              (levels_set_iterator._M_current._0_4_ != 2.8026e-45)) ||
             ((1.0 < ((reference)run._24_8_)->inner[0] && (1.0 < ((reference)run._24_8_)->inner[1]))
             )) {
            _run::_run((_run *)local_f8);
            local_f8 = *(undefined1 (*) [8])run._24_8_;
            run.inner = *(float (*) [2])(run._24_8_ + 8);
            run.outer._0_8_ = *(undefined8 *)(run._24_8_ + 0x10);
            run.outer[2] = local_94;
            run.outer[3] = levels_set_iterator._M_current._0_4_;
            std::
            vector<glcts::TessellationShaderPointsVerification::_run,_std::allocator<glcts::TessellationShaderPointsVerification::_run>_>
            ::push_back(&this->m_runs,(value_type *)local_f8);
          }
          __gnu_cxx::
          __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
          ::operator++(&local_c0,0);
        }
      }
      std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
      ~vector((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *)
              local_90);
    }
    this_01 = (TessellationShaderUtils *)operator_new(0x20);
    TessellationShaderUtils::TessellationShaderUtils(this_01,local_18,&this->super_TestCaseBase);
    this->m_utils = this_01;
    return;
  }
  primitive_modes[2]._3_1_ = 1;
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Tessellation shader functionality not supported, skipping",
             &local_39);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
  primitive_modes[2]._3_1_ = TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST >> 0x18;
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void TessellationShaderPointsVerification::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize and bind vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Initialize all test iterations */
	const _tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES };
	const unsigned int n_primitive_modes = sizeof(primitive_modes) / sizeof(primitive_modes[0]);

	const _tessellation_shader_vertex_spacing vertex_spacings[] = {
		TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
		TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN,
	};
	const unsigned int n_vertex_spacings = sizeof(vertex_spacings) / sizeof(vertex_spacings[0]);

	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		_tessellation_levels_set	 levels_set;
		_tessellation_primitive_mode primitive_mode = primitive_modes[n_primitive_mode];

		levels_set = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
			primitive_mode, gl_max_tess_gen_level_value,
			TESSELLATION_LEVEL_SET_FILTER_INNER_AND_OUTER_LEVELS_USE_DIFFERENT_VALUES);

		for (unsigned int n_vertex_spacing = 0; n_vertex_spacing < n_vertex_spacings; ++n_vertex_spacing)
		{
			_tessellation_shader_vertex_spacing vertex_spacing = vertex_spacings[n_vertex_spacing];

			for (_tessellation_levels_set_const_iterator levels_set_iterator = levels_set.begin();
				 levels_set_iterator != levels_set.end(); levels_set_iterator++)
			{
				const _tessellation_levels& levels = *levels_set_iterator;

				/* Skip border cases that this test cannot handle */
				if ((primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS ||
					 primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) &&
					vertex_spacing == TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD &&
					(levels.inner[0] <= 1 || levels.inner[1] <= 1))
				{
					continue;
				}

				/* Initialize a test run descriptor for the iteration-specific properties */
				_run run;

				memcpy(run.inner, levels.inner, sizeof(run.inner));
				memcpy(run.outer, levels.outer, sizeof(run.outer));

				run.primitive_mode = primitive_mode;
				run.vertex_spacing = vertex_spacing;

				m_runs.push_back(run);
			} /* for (all level sets) */
		}	 /* for (all vertex spacing modes) */
	}		  /* for (all primitive modes) */

	/* Initialize utils instance.
	 */
	m_utils = new TessellationShaderUtils(gl, this);
}